

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void __thiscall Test_Template_Strip::Test_Template_Strip(Test_Template_Strip *this)

{
  value_type local_18;
  Test_Template_Strip *local_10;
  Test_Template_Strip *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(Template, Strip) {
  TemplateDictionary dict("dict");
  dict.SetValue("FOO", "foo");

  const char* tests[][4] = {  // 0: in, 1: do-not-strip, 2: blanklines, 3: ws
    {"hi!\n", "hi!\n", "hi!\n", "hi!"},
    {"hi!", "hi!", "hi!", "hi!"},
    // These test strip-blank-lines, primarily
    {"{{FOO}}\n\n{{FOO}}", "foo\n\nfoo", "foo\nfoo", "foofoo"},
    {"{{FOO}}\r\n\r\n{{FOO}}", "foo\r\n\r\nfoo", "foo\r\nfoo", "foofoo"},
    {"{{FOO}}\n   \n{{FOO}}\n", "foo\n   \nfoo\n", "foo\nfoo\n", "foofoo"},
    {"{{FOO}}\n{{BI_NEWLINE}}\nb", "foo\n\n\nb", "foo\n\n\nb", "foo\nb"},
    {"{{FOO}}\n{{!comment}}\nb", "foo\n\nb", "foo\nb", "foob"},
    {"{{FOO}}\n{{!comment}}{{!comment2}}\nb", "foo\n\nb", "foo\n\nb", "foob"},
    {"{{FOO}}\n{{>ONE_INC}}\nb", "foo\n\nb", "foo\nb", "foob"},
    {"{{FOO}}\n\t{{>ONE_INC}}  \nb", "foo\n\t  \nb", "foo\nb", "foob"},
    {"{{FOO}}\n{{>ONE_INC}}{{>TWO_INC}}\nb", "foo\n\nb", "foo\n\nb", "foob"},
    {"{{FOO}}\n  {{#SEC}}\ntext \n  {{/SEC}}\n", "foo\n  \n", "foo\n", "foo"},
    {"{{%AUTOESCAPE context=\"HTML\"}}\nBLA", "\nBLA", "BLA", "BLA"},
    // These test strip-whitespace
    {"foo\nbar\n", "foo\nbar\n", "foo\nbar\n", "foobar"},
    {"{{FOO}}\nbar\n", "foo\nbar\n", "foo\nbar\n", "foobar"},
    {"  {{FOO}}  {{!comment}}\nb", "  foo  \nb", "  foo  \nb", "foo  b"},
    {"  {{FOO}}  {{BI_SPACE}}\n", "  foo   \n", "  foo   \n", "foo   "},
    {"  \t \f\v  \n\r\n  ", "  \t \f\v  \n\r\n  ", "", ""},
  };

  for (int i = 0; i < sizeof(tests)/sizeof(*tests); ++i) {
    Template* tpl1 = StringToTemplate(tests[i][0], DO_NOT_STRIP);
    Template* tpl2 = StringToTemplate(tests[i][0], STRIP_BLANK_LINES);
    Template* tpl3 = StringToTemplate(tests[i][0], STRIP_WHITESPACE);
    AssertExpandIs(tpl1, &dict, tests[i][1], true);
    AssertExpandIs(tpl2, &dict, tests[i][2], true);
    AssertExpandIs(tpl3, &dict, tests[i][3], true);
  }
}